

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
* __thiscall
jsonnet::internal::SortImports::splitFodder
          (pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
           *__return_storage_ptr__,SortImports *this,Fodder *fodder)

{
  FodderElement *__x;
  pointer pFVar1;
  bool bVar2;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *ppVar3;
  uint *__args_1;
  pointer pFVar4;
  Fodder beforeNext;
  Fodder afterPrev;
  Kind local_8c;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_88;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_68;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pFVar4 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = __return_storage_ptr__;
  if (pFVar4 != pFVar1) {
    bVar2 = false;
    __args_1 = &pFVar4->blanks;
    do {
      __x = (FodderElement *)(__args_1 + -1);
      if (bVar2) {
        fodder_push_back((Fodder *)&local_88,__x);
      }
      else {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::push_back(&local_68,__x);
      }
      if (!(bool)(__x->kind == INTERSTITIAL | bVar2)) {
        bVar2 = true;
        if (*__args_1 != 0) {
          local_68.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].blanks = 0;
          if (local_88.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("beforeNext.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                          ,0x866,
                          "std::pair<Fodder, Fodder> jsonnet::internal::SortImports::splitFodder(const Fodder &)"
                         );
          }
          local_8c = LINE_END;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
          ::
          emplace_back<jsonnet::internal::FodderElement::Kind,unsigned_int_const&,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
                      *)&local_88,&local_8c,__args_1,__args_1 + 1,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      pFVar4 = (pointer)(__args_1 + 9);
      __args_1 = __args_1 + 10;
    } while (pFVar4 != pFVar1);
  }
  ppVar3 = local_50;
  std::
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  ::
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_true>
            (local_50,&local_68,&local_88);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_88);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_68);
  return ppVar3;
}

Assistant:

std::pair<Fodder, Fodder> splitFodder(const Fodder &fodder)
    {
        Fodder afterPrev, beforeNext;
        bool inSecondPart = false;
        for (const auto &fodderElem : fodder) {
            if (inSecondPart) {
                fodder_push_back(beforeNext, fodderElem);
            } else {
                afterPrev.push_back(fodderElem);
            }
            if (fodderElem.kind != FodderElement::Kind::INTERSTITIAL && !inSecondPart) {
                inSecondPart = true;
                if (fodderElem.blanks > 0) {
                    // If there are any blank lines at the end of afterPrev, move them
                    // to beforeNext.
                    afterPrev.back().blanks = 0;
                    assert(beforeNext.empty());
                    beforeNext.emplace_back(FodderElement::Kind::LINE_END,
                                            fodderElem.blanks,
                                            fodderElem.indent,
                                            std::vector<std::string>());
                }
            }
        }
        return {afterPrev, beforeNext};
    }